

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

ggml_cgraph * whisper_build_graph_encoder(whisper_context *wctx,whisper_state *wstate)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  ggml_cgraph *pgVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  const_reference pvVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  long in_RSI;
  long in_RDI;
  float fVar17;
  ggml_tensor *inpFF;
  ggml_tensor *KQV_merged;
  ggml_tensor *KQV;
  ggml_tensor *V_1;
  ggml_tensor *KQ_soft_max;
  ggml_tensor *KQ;
  ggml_tensor *K_1;
  ggml_tensor *V;
  ggml_tensor *K;
  ggml_tensor *Q;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  value_type *layer;
  int il;
  ggml_tensor *inpL;
  ggml_tensor *e_pe;
  size_t e_pe_offset;
  size_t e_pe_stride;
  float KQscale;
  ggml_tensor *cur;
  ggml_cgraph *gf;
  ggml_context *ctx0;
  ggml_init_params params;
  int n_ctx_pad;
  whisper_kv_cache *kv_pad;
  int n_state_head;
  int n_layer;
  int n_head;
  int n_state;
  int n_ctx;
  whisper_hparams *hparams;
  whisper_model *model;
  int local_134;
  int local_bc;
  undefined8 local_b8;
  undefined8 local_90;
  
  if (*(int *)(in_RSI + 0xa738) < 1) {
    local_134 = *(int *)(in_RDI + 0x50);
  }
  else {
    local_134 = *(int *)(in_RSI + 0xa738);
  }
  iVar1 = *(int *)(in_RDI + 0x54);
  iVar2 = *(int *)(in_RDI + 0x58);
  iVar3 = *(int *)(in_RDI + 0x5c);
  iVar4 = iVar1 / iVar2;
  if (*(long *)(in_RSI + 0x138) == 0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"WHISPER_ASSERT: %s:%d: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/src/whisper.cpp"
               ,0x812,"!!kv_pad.buffer");
    abort();
  }
  uVar5 = local_134 + 0xffU & 0xffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 0xa5b0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x203c68);
  uVar6 = ggml_init();
  pgVar7 = (ggml_cgraph *)ggml_new_graph_custom(uVar6,0x1000,0);
  uVar8 = ggml_view_tensor(uVar6,*(undefined8 *)(in_RSI + 0xa608));
  fVar17 = sqrtf((float)iVar4);
  lVar15 = *(long *)(*(long *)(in_RDI + 0xa0) + 0x10);
  lVar9 = ggml_element_size(*(undefined8 *)(in_RDI + 0xa0));
  lVar16 = *(long *)(*(long *)(in_RDI + 0xa0) + 0x10);
  lVar10 = ggml_element_size(*(undefined8 *)(in_RDI + 0xa0));
  uVar11 = ggml_view_2d(uVar6,*(undefined8 *)(in_RDI + 0xa0),
                        *(undefined8 *)(*(long *)(in_RDI + 0xa0) + 0x10),(long)local_134,
                        lVar15 * lVar9,
                        lVar16 * lVar10 * (long)local_134 * (long)whisper_build_graph_encoder::iter)
  ;
  uVar8 = ggml_transpose(uVar6,uVar8);
  uVar8 = ggml_cont(uVar6,uVar8);
  local_b8 = ggml_add(uVar6,uVar11,uVar8);
  for (local_bc = 0; local_bc < iVar3; local_bc = local_bc + 1) {
    pvVar12 = std::vector<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_>::operator[]
                        ((vector<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_> *)
                         (in_RDI + 0xf8),(long)local_bc);
    uVar8 = ggml_norm(*(undefined4 *)(in_RDI + 0x78),uVar6,local_b8);
    uVar8 = ggml_mul(uVar6,uVar8,pvVar12->attn_ln_0_w);
    uVar8 = ggml_add(uVar6,uVar8,pvVar12->attn_ln_0_b);
    uVar11 = ggml_mul_mat(uVar6,pvVar12->attn_q_w,uVar8);
    uVar11 = ggml_add(uVar6,uVar11,pvVar12->attn_q_b);
    uVar13 = ggml_mul_mat(uVar6,pvVar12->attn_k_w,uVar8);
    uVar8 = ggml_mul_mat(uVar6,pvVar12->attn_v_w,uVar8);
    uVar8 = ggml_add(uVar6,uVar8,pvVar12->attn_v_b);
    uVar11 = ggml_reshape_3d(uVar6,uVar11,(long)iVar4,(long)iVar2,(long)local_134);
    uVar11 = ggml_permute(uVar6,uVar11,0,2,1,3);
    if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
      uVar13 = ggml_reshape_3d(uVar6,uVar13,(long)iVar4,(long)iVar2,(long)local_134);
      uVar13 = ggml_cast(uVar6,uVar13,*(undefined4 *)(in_RDI + 0x14));
      uVar13 = ggml_permute(uVar6,uVar13,0,2,1,3);
      uVar11 = ggml_mul_mat(uVar6,uVar13,uVar11);
      uVar11 = ggml_soft_max_ext(1.0 / fVar17,0,uVar6,uVar11,0);
      uVar8 = ggml_reshape_3d(uVar6,uVar8,(long)iVar4,(long)iVar2,(long)local_134);
      uVar8 = ggml_permute(uVar6,uVar8,1,2,0,3);
      uVar8 = ggml_cast(uVar6,uVar8,*(undefined4 *)(in_RDI + 0x14));
      uVar8 = ggml_mul_mat(uVar6,uVar8,uVar11);
      uVar8 = ggml_permute(uVar6,uVar8,0,2,1,3);
      local_90 = ggml_cont_2d(uVar6,uVar8,(long)iVar1,(long)local_134);
    }
    else {
      uVar14 = ggml_view_1d(uVar6,*(undefined8 *)(in_RSI + 0x128),(long)(local_134 * iVar1),0);
      uVar13 = ggml_cpy(uVar6,uVar13,uVar14);
      ggml_build_forward_expand(pgVar7,uVar13);
      uVar13 = ggml_view_1d(uVar6,*(undefined8 *)(in_RSI + 0x130),(long)(local_134 * iVar1),0);
      uVar8 = ggml_cpy(uVar6,uVar8,uVar13);
      ggml_build_forward_expand(pgVar7,uVar8);
      uVar8 = *(undefined8 *)(in_RSI + 0x128);
      lVar15 = ggml_element_size(*(undefined8 *)(in_RSI + 0x128));
      lVar16 = ggml_element_size(*(undefined8 *)(in_RSI + 0x128));
      uVar13 = ggml_view_3d(uVar6,uVar8,(long)iVar4,(long)(int)uVar5,(long)iVar2,lVar15 * iVar1,
                            lVar16 * iVar4,0);
      uVar8 = *(undefined8 *)(in_RSI + 0x130);
      lVar15 = ggml_element_size(*(undefined8 *)(in_RSI + 0x130));
      lVar16 = ggml_element_size(*(undefined8 *)(in_RSI + 0x130));
      uVar8 = ggml_view_3d(uVar6,uVar8,(long)iVar4,(long)(int)uVar5,(long)iVar2,lVar15 * iVar1,
                           lVar16 * iVar4,0);
      uVar8 = ggml_flash_attn_ext(1.0 / fVar17,uVar6,uVar11,uVar13,uVar8,0);
      local_90 = ggml_reshape_2d(uVar6,uVar8,(long)iVar1,(long)local_134);
    }
    uVar8 = ggml_mul_mat(uVar6,pvVar12->attn_ln_1_w,local_90);
    uVar8 = ggml_add(uVar6,uVar8,pvVar12->attn_ln_1_b);
    uVar8 = ggml_add(uVar6,uVar8,local_b8);
    uVar11 = ggml_norm(*(undefined4 *)(in_RDI + 0x78),uVar6,uVar8);
    uVar11 = ggml_mul(uVar6,uVar11,pvVar12->mlp_ln_w);
    uVar11 = ggml_add(uVar6,uVar11,pvVar12->mlp_ln_b);
    uVar11 = ggml_mul_mat(uVar6,pvVar12->mlp_0_w,uVar11);
    uVar11 = ggml_add(uVar6,uVar11,pvVar12->mlp_0_b);
    uVar11 = ggml_gelu(uVar6,uVar11);
    uVar11 = ggml_mul_mat(uVar6,pvVar12->mlp_1_w,uVar11);
    uVar11 = ggml_add(uVar6,uVar11,pvVar12->mlp_1_b);
    local_b8 = ggml_add(uVar6,uVar11,uVar8);
  }
  uVar8 = ggml_norm(*(undefined4 *)(in_RDI + 0x78),uVar6,local_b8);
  uVar8 = ggml_mul(uVar6,uVar8,*(undefined8 *)(in_RDI + 200));
  uVar8 = ggml_add(uVar6,uVar8,*(undefined8 *)(in_RDI + 0xd0));
  ggml_build_forward_expand(pgVar7,uVar8);
  *(undefined8 *)(in_RSI + 0xa610) = uVar8;
  ggml_free(uVar6);
  return pgVar7;
}

Assistant:

static struct ggml_cgraph * whisper_build_graph_encoder(
        whisper_context & wctx,
          whisper_state & wstate) {
    const auto & model   = wctx.model;
    const auto & hparams = model.hparams;

    const int n_ctx   = wstate.exp_n_audio_ctx > 0 ? wstate.exp_n_audio_ctx : hparams.n_audio_ctx;
    const int n_state = hparams.n_audio_state;
    const int n_head  = hparams.n_audio_head;
    const int n_layer = hparams.n_audio_layer;

    const int n_state_head = n_state/n_head;

    auto & kv_pad = wstate.kv_pad;

    WHISPER_ASSERT(!!kv_pad.buffer);

    const int n_ctx_pad = GGML_PAD(n_ctx, 256);

    struct ggml_init_params params = {
        /*.mem_size   =*/ wstate.sched_encode.meta.size(),
        /*.mem_buffer =*/ wstate.sched_encode.meta.data(),
        /*.no_alloc   =*/ true,
    };

    struct ggml_context * ctx0 = ggml_init(params);

    ggml_cgraph * gf = ggml_new_graph_custom(ctx0, WHISPER_MAX_NODES, false);

    struct ggml_tensor * cur = ggml_view_tensor(ctx0, wstate.embd_conv);

    const float KQscale = 1.0f/sqrtf(float(n_state_head));

    // ===================================================================
    // NOTE: experimenting with partial evaluation of the encoder (ignore)
    //static int iter = -1;
    //const int n_iter = 1500/n_ctx;

    //iter = (iter + 1) % n_iter;

    //if (iter == 0) {
    //    memset(model.memory_cross_k->data, 0, ggml_nbytes(model.memory_cross_k));
    //    memset(model.memory_cross_v->data, 0, ggml_nbytes(model.memory_cross_v));
    //}

    static int iter = 0;

    const size_t e_pe_stride = model.e_pe->ne[0]*ggml_element_size(model.e_pe);
    const size_t e_pe_offset = model.e_pe->ne[0]*ggml_element_size(model.e_pe)*n_ctx*iter;

    struct ggml_tensor * e_pe = ggml_view_2d(ctx0, model.e_pe, model.e_pe->ne[0], n_ctx, e_pe_stride, e_pe_offset);
    cur = ggml_add(ctx0, e_pe, ggml_cont(ctx0, ggml_transpose(ctx0, cur)));

    // ===================================================================

    // original:
    //cur = ggml_add(ctx0, model.e_pe, ggml_transpose(ctx0, cur));

    struct ggml_tensor * inpL = cur;

    for (int il = 0; il < n_layer; ++il) {
        const auto & layer = model.layers_encoder[il];

        // norm
        {
            cur = ggml_norm(ctx0, inpL, hparams.eps);

            // cur = ln_0_w*cur + ln_0_b
            cur = ggml_add(ctx0,
                    ggml_mul(ctx0, cur, layer.attn_ln_0_w),
                    layer.attn_ln_0_b);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_mul_mat(ctx0,
                    layer.attn_q_w,
                    cur);

            Qcur = ggml_add(ctx0, Qcur, layer.attn_q_b);

            //Qcur = ggml_scale(ctx0, Qcur, pow(float(n_state_head), -0.25));

            // note: no bias for Key
            struct ggml_tensor * Kcur = ggml_mul_mat(ctx0,
                    layer.attn_k_w,
                    cur);

            //Kcur = ggml_scale(ctx0, Kcur, pow(float(n_state_head), -0.25));

            struct ggml_tensor * Vcur = ggml_mul_mat(ctx0,
                    layer.attn_v_w,
                    cur);

            Vcur = ggml_add(ctx0, Vcur, layer.attn_v_b);

            // ------

            struct ggml_tensor * Q =
                ggml_permute(ctx0,
                        ggml_reshape_3d(ctx0, Qcur, n_state_head, n_head, n_ctx),
                        0, 2, 1, 3);

            if (wctx.params.flash_attn) {
                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Kcur, ggml_view_1d(ctx0, kv_pad.k, n_ctx*n_state, 0)));
                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Vcur, ggml_view_1d(ctx0, kv_pad.v, n_ctx*n_state, 0)));

                struct ggml_tensor * K =
                    ggml_view_3d(ctx0, kv_pad.k,
                            n_state_head, n_ctx_pad, n_head,
                            ggml_element_size(kv_pad.k)*n_state,
                            ggml_element_size(kv_pad.k)*n_state_head,
                            0);

                struct ggml_tensor * V =
                    ggml_view_3d(ctx0, kv_pad.v,
                            n_state_head, n_ctx_pad, n_head,
                            ggml_element_size(kv_pad.v)*n_state,
                            ggml_element_size(kv_pad.v)*n_state_head,
                            0);

                cur = ggml_flash_attn_ext(ctx0, Q, K, V, nullptr, KQscale, 0.0f, 0.0f);

                cur = ggml_reshape_2d(ctx0, cur, n_state, n_ctx);
            } else {
                struct ggml_tensor * K =
                    ggml_permute(ctx0,
                            ggml_cast(ctx0,
                                ggml_reshape_3d(ctx0, Kcur, n_state_head, n_head, n_ctx),
                                wctx.itype),
                            0, 2, 1, 3);

                // K * Q
                struct ggml_tensor * KQ = ggml_mul_mat(ctx0, K, Q);

                struct ggml_tensor * KQ_soft_max = ggml_soft_max_ext(ctx0, KQ, nullptr, KQscale, 0.0f);

                struct ggml_tensor * V =
                    ggml_cast(ctx0,
                            ggml_permute(ctx0,
                                ggml_reshape_3d(ctx0,
                                    Vcur,
                                    n_state_head, n_head, n_ctx),
                                1, 2, 0, 3),
                            wctx.itype);

                struct ggml_tensor * KQV = ggml_mul_mat(ctx0, V, KQ_soft_max);

                struct ggml_tensor * KQV_merged = ggml_permute(ctx0, KQV, 0, 2, 1, 3);

                cur = ggml_cont_2d(ctx0, KQV_merged, n_state, n_ctx);
            }
        }

        // projection
        {
            cur = ggml_mul_mat(ctx0,
                    layer.attn_ln_1_w,
                    cur);

            cur = ggml_add(ctx0, cur, layer.attn_ln_1_b);
        }

        // add the input
        cur = ggml_add(ctx0, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx0, inpFF, hparams.eps);

                // cur = mlp_ln_w*cur + mlp_ln_b
                cur = ggml_add(ctx0,
                        ggml_mul(ctx0, cur, layer.mlp_ln_w),
                        layer.mlp_ln_b);
            }

            // fully connected
            cur = ggml_mul_mat(ctx0,
                    layer.mlp_0_w,
                    cur);

            cur = ggml_add(ctx0, cur, layer.mlp_0_b);

            // GELU activation
            cur = ggml_gelu(ctx0, cur);

            // projection
            cur = ggml_mul_mat(ctx0,
                    layer.mlp_1_w,
                    cur);

            cur = ggml_add(ctx0, cur, layer.mlp_1_b);
        }

        inpL = ggml_add(ctx0, cur, inpFF);
    }

    cur = inpL;

    // norm
    {
        cur = ggml_norm(ctx0, cur, hparams.eps);

        // cur = ln_f_g*cur + ln_f_b
        cur = ggml_add(ctx0,
                ggml_mul(ctx0, cur, model.e_ln_w),
                model.e_ln_b);
    }

    ggml_build_forward_expand(gf, cur);

    wstate.embd_enc = cur;

    //ggml_graph_print(gf);

    ////////////////////////////////////////////////////////////////////////////

    //printf("%s: used_mem = %f MB, %f MB, %f MB %f MB %f MB\n", __func__,
    //        ggml_used_mem(ctx0)/1e6,
    //        wstate.get_buf_max_mem(0)/1e6,
    //        wstate.get_buf_max_mem(1)/1e6,
    //        wstate.get_buf_max_mem(2)/1e6,
    //        wstate.get_buf_max_mem(3)/1e6);

    ggml_free(ctx0);

    return gf;
}